

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglibnetworkinformationbackend.cpp
# Opt level: O0

QNetworkInformationBackend * __thiscall
QGlibNetworkInformationBackendFactory::create
          (QGlibNetworkInformationBackendFactory *this,Features requiredFeatures)

{
  long lVar1;
  bool bVar2;
  QFlags<QNetworkInformation::Feature> lhs;
  QGlibNetworkInformationBackend *pQVar3;
  QFlags<QNetworkInformation::Feature> in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  QGlibNetworkInformationBackend *backend;
  void **in_stack_ffffffffffffffa8;
  QGlibNetworkInformationBackend *in_stack_ffffffffffffffb0;
  QGlibNetworkInformationBackend *in_stack_ffffffffffffffb8;
  QNetworkInformationBackend *local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (**(code **)(*in_RDI + 0x70))();
  lhs = QFlags<QNetworkInformation::Feature>::operator&
                  ((QFlags<QNetworkInformation::Feature> *)in_stack_ffffffffffffffb0,
                   (QFlagsStorageHelper<QNetworkInformation::Feature,_4>)
                   SUB84(in_stack_ffffffffffffffb8,0));
  bVar2 = operator!=(lhs,in_ESI);
  if (bVar2) {
    local_28 = (QNetworkInformationBackend *)0x0;
  }
  else {
    local_28 = (QNetworkInformationBackend *)operator_new(0x40);
    QGlibNetworkInformationBackend::QGlibNetworkInformationBackend(in_stack_ffffffffffffffb0);
    bVar2 = QGlibNetworkInformationBackend::isValid(in_stack_ffffffffffffffb8);
    if ((!bVar2) &&
       (pQVar3 = std::exchange<QGlibNetworkInformationBackend*,decltype(nullptr)>
                           ((QGlibNetworkInformationBackend **)in_stack_ffffffffffffffb0,
                            in_stack_ffffffffffffffa8),
       pQVar3 != (QGlibNetworkInformationBackend *)0x0)) {
      (**(code **)(*(long *)pQVar3 + 0x20))();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

QNetworkInformationBackend *create(QNetworkInformation::Features requiredFeatures) const override
    {
        if ((requiredFeatures & featuresSupported()) != requiredFeatures)
            return nullptr;
        auto backend = new QGlibNetworkInformationBackend();
        if (!backend->isValid())
            delete std::exchange(backend, nullptr);
        return backend;
    }